

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O1

void test_AString_shrinkToFit_success_smallerThanMinSize_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *expr;
  char **ppcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *pcStack_68;
  char *pcStack_60;
  char *local_58;
  undefined8 uStack_50;
  AString string;
  
  string.reallocator._0_4_ = 0x11e238;
  string.reallocator._4_4_ = 0;
  string.deallocator._0_4_ = 0x11e278;
  string.deallocator._4_4_ = 0;
  string.buffer = (char *)0x0;
  string.size = 3;
  string.capacity = 0x10;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x1210b0;
  string.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,0x11);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(string.buffer,"012",4);
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x1210de;
  bVar1 = AString_shrinkToFit(&string);
  if (bVar1 == false) {
    iVar2 = 0x17b;
LAB_001213e3:
    uStack_50 = 0x1213ef;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,iVar2,"Assertion \'AString_shrinkToFit(&string)\' failed",0,0);
  }
  uStack_50 = 0x1210f7;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x17b);
  if (string.capacity != 8) {
    iVar2 = 0x17c;
LAB_0012141e:
    pcStack_60 = "(8)";
    pcVar6 = "(string).capacity";
    pcVar5 = "(string).capacity == (8)";
    local_58 = (char *)0x8;
    pcVar7 = (char *)string.capacity;
    goto LAB_0012152d;
  }
  uStack_50 = 0x121117;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x17c);
  if (string.buffer == (char *)0x0) {
    iVar2 = 0x17c;
LAB_0012145c:
    uStack_50 = 0;
    local_58 = (char *)0x0;
    pcStack_60 = (char *)0x121463;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,iVar2,"Assertion \'_ck_x != NULL\' failed",
                      "Assertion \'%s\' failed: %s == %#x","(void*) (string).buffer != NULL",
                      "(void*) (string).buffer");
  }
  uStack_50 = 0x121134;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x17c);
  pcVar8 = string.buffer;
  if (string.buffer == (char *)0x0) {
    pcVar7 = "";
    pcVar8 = "(null)";
LAB_0012132d:
    iVar2 = 0x17c;
  }
  else {
    uStack_50 = 0x121154;
    iVar2 = strcmp("012",string.buffer);
    if (iVar2 != 0) {
      pcVar7 = "\"";
      goto LAB_0012132d;
    }
    uStack_50 = 0x12116d;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x17c);
    if (string.size != 3) {
      iVar2 = 0x17c;
LAB_001214f0:
      pcStack_60 = "strlen(\"012\")";
      pcVar6 = "(string).size";
      pcVar5 = "(string).size == strlen(\"012\")";
      local_58 = (char *)0x3;
      pcVar7 = (char *)string.size;
LAB_0012152d:
      expr = "Assertion \'_ck_x == _ck_y\' failed";
      pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      ppcVar4 = &pcStack_60;
      goto LAB_0012152f;
    }
    uStack_50 = 0x12118d;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x17c);
    if (private_ACUtilsTest_AString_reallocCount != 1) {
      iVar2 = 0x17d;
LAB_00121527:
      pcStack_60 = "(1)";
      pcVar6 = "private_ACUtilsTest_AString_reallocCount";
      pcVar5 = "private_ACUtilsTest_AString_reallocCount == (1)";
      local_58 = (char *)0x1;
      pcVar7 = (char *)private_ACUtilsTest_AString_reallocCount;
      goto LAB_0012152d;
    }
    uStack_50 = 0x1211af;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x17d);
    uStack_50 = 0x1211b7;
    bVar1 = AString_shrinkToFit(&string);
    if (bVar1 == false) {
      iVar2 = 0x17e;
      goto LAB_001213e3;
    }
    uStack_50 = 0x1211d0;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x17e);
    if (string.capacity != 8) {
      iVar2 = 0x17f;
      goto LAB_0012141e;
    }
    uStack_50 = 0x1211f0;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x17f);
    if (string.buffer == (char *)0x0) {
      iVar2 = 0x17f;
      goto LAB_0012145c;
    }
    uStack_50 = 0x12120d;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x17f);
    pcVar8 = string.buffer;
    if (string.buffer == (char *)0x0) {
      pcVar8 = "(null)";
      pcVar7 = "";
    }
    else {
      uStack_50 = 0x12122a;
      iVar2 = strcmp("012",string.buffer);
      if (iVar2 == 0) {
        uStack_50 = 0x121243;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x17f);
        if (string.size != 3) {
          iVar2 = 0x17f;
          goto LAB_001214f0;
        }
        uStack_50 = 0x121263;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x17f);
        if (private_ACUtilsTest_AString_reallocCount == 1) {
          uStack_50 = 0x121285;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x180);
          uStack_50 = 0x12128e;
          (*(code *)CONCAT44(string.deallocator._4_4_,string.deallocator._0_4_))(string.buffer);
          return;
        }
        iVar2 = 0x180;
        goto LAB_00121527;
      }
      pcVar7 = "\"";
    }
    iVar2 = 0x17f;
  }
  pcVar6 = "(string).buffer";
  pcVar5 = "(string).buffer == (\"012\")";
  expr = 
  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
  ;
  pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
  local_58 = "\"";
  pcStack_60 = "012";
  pcStack_68 = "\"";
  pcStack_70 = "(\"012\")";
  ppcVar4 = &pcStack_80;
  pcStack_80 = pcVar8;
  pcStack_78 = pcVar7;
LAB_0012152f:
  uStack_50 = 0;
  *(char **)((long)ppcVar4 + -8) = pcVar7;
  *(code **)((long)ppcVar4 + -0x10) = test_AString_shrinkToFit_success_hasNotLeastCapacity_fn;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar2,expr,pcVar3,pcVar5,pcVar6);
}

Assistant:

START_TEST(test_AString_shrinkToFit_success_smallerThanMinSize)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("012", 16);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT(AString_shrinkToFit(&string));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "012", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(1);
    ACUTILSTEST_ASSERT(AString_shrinkToFit(&string));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "012", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(1);
    private_ACUtilsTest_AString_destructTestString(string);
}